

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O1

bool __thiscall libebml::EbmlMaster::ProcessMandatory(EbmlMaster *this)

{
  EbmlSemantic *pEVar1;
  bool bVar2;
  EbmlElement *in_RAX;
  ulong uVar3;
  EbmlSemanticContext *pEVar4;
  ulong uVar5;
  EbmlElement *local_28;
  
  if ((this->Context->Size != 0) && (pEVar4 = this->Context, pEVar4->Size != 0)) {
    uVar3 = 0;
    uVar5 = 1;
    local_28 = in_RAX;
    do {
      pEVar1 = pEVar4->MyTable;
      if ((pEVar1[uVar3].Mandatory == true) && (pEVar1[uVar3].Unique == true)) {
        local_28 = (*(pEVar1[uVar3].GetCallbacks)->Create)();
        std::vector<libebml::EbmlElement*,std::allocator<libebml::EbmlElement*>>::
        emplace_back<libebml::EbmlElement*>
                  ((vector<libebml::EbmlElement*,std::allocator<libebml::EbmlElement*>> *)
                   &this->ElementList,&local_28);
      }
      pEVar4 = this->Context;
      bVar2 = uVar5 < pEVar4->Size;
      uVar3 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar2);
  }
  return true;
}

Assistant:

bool EbmlMaster::ProcessMandatory()
{
  if (EBML_CTX_SIZE(Context) == 0)
  {
    return true;
  }

  assert(Context.GetSize() != 0);

  unsigned int EltIdx;
  for (EltIdx = 0; EltIdx < EBML_CTX_SIZE(Context); EltIdx++) {
    if (EBML_CTX_IDX(Context,EltIdx).IsMandatory() && EBML_CTX_IDX(Context,EltIdx).IsUnique()) {
//      assert(EBML_CTX_IDX(Context,EltIdx).Create != NULL);
            PushElement(EBML_SEM_CREATE(EBML_CTX_IDX(Context,EltIdx)));
    }
  }
  return true;
}